

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::makeConst<wasm::WATParser::(anonymous_namespace)::ParseDeclsCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,Index pos,
          Type type)

{
  BasicType BVar1;
  optional<int> oVar2;
  optional<float> oVar3;
  undefined4 in_register_00000014;
  string *this;
  optional<long> oVar4;
  optional<double> oVar5;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Type local_48;
  Type type_local;
  allocator<char> local_19;
  
  local_48.id = CONCAT44(in_register_00000014,pos);
  if (6 < local_48.id) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                  ,0xc1a,
                  "Result<typename Ctx::InstrT> wasm::WATParser::(anonymous namespace)::makeConst(Ctx &, Index, Type) [Ctx = wasm::WATParser::(anonymous namespace)::ParseDeclsCtx]"
                 );
  }
  BVar1 = wasm::Type::getBasic(&local_48);
  switch(BVar1) {
  case i32:
    oVar2 = ParseInput::takeI32(&ctx->in);
    if (((ulong)oVar2.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
LAB_00a7828a:
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
           '\0';
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"expected i32",&local_19)
    ;
    ParseInput::err((Err *)&type_local,&ctx->in,&local_e8);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
               __return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_e8;
    break;
  case i64:
    oVar4 = ParseInput::takeI64(&ctx->in);
    if (((undefined1  [16])
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00a7828a;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"expected i64",&local_19)
    ;
    ParseInput::err((Err *)&type_local,&ctx->in,&local_c8);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
               __return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_c8;
    break;
  case f32:
    oVar3 = ParseInput::takeF32(&ctx->in);
    if (((ulong)oVar3.super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float> >> 0x20 & 1) != 0) goto LAB_00a7828a;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"expected f32",&local_19)
    ;
    ParseInput::err((Err *)&type_local,&ctx->in,&local_a8);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
               __return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_a8;
    break;
  case f64:
    oVar5 = ParseInput::takeF64(&ctx->in);
    if (((undefined1  [16])
         oVar5.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_00a7828a;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"expected f64",&local_19)
    ;
    ParseInput::err((Err *)&type_local,&ctx->in,&local_88);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
               __return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_88;
    break;
  case v128:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"unimplemented instruction",&local_19);
    ParseInput::err((Err *)&type_local,&ctx->in,&local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err>::
    _Variant_storage<1ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::Err> *)
               __return_storage_ptr__,&type_local);
    std::__cxx11::string::~string((string *)&type_local);
    this = &local_68;
    break;
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wat-parser.cpp"
                       ,0xc36);
  }
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeConst(Ctx& ctx, Index pos, Type type) {
  assert(type.isBasic());
  switch (type.getBasic()) {
    case Type::i32:
      if (auto c = ctx.in.takeI32()) {
        return ctx.makeI32Const(pos, *c);
      }
      return ctx.in.err("expected i32");
    case Type::i64:
      if (auto c = ctx.in.takeI64()) {
        return ctx.makeI64Const(pos, *c);
      }
      return ctx.in.err("expected i64");
    case Type::f32:
      if (auto c = ctx.in.takeF32()) {
        return ctx.makeF32Const(pos, *c);
      }
      return ctx.in.err("expected f32");
    case Type::f64:
      if (auto c = ctx.in.takeF64()) {
        return ctx.makeF64Const(pos, *c);
      }
      return ctx.in.err("expected f64");
    case Type::v128:
      return ctx.in.err("unimplemented instruction");
    case Type::none:
    case Type::unreachable:
      break;
  }
  WASM_UNREACHABLE("unexpected type");
}